

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O2

void __thiscall
UniformData::set(UniformData *this,UniformValue *_value,size_t _size,bool _int,bool _queue)

{
  undefined8 uVar1;
  undefined3 in_register_00000081;
  
  this->bInt = _int;
  this->size = _size;
  if ((CONCAT31(in_register_00000081,_queue) == 0) || (this->change != true)) {
    uVar1 = *(undefined8 *)(_value->_M_elems + 2);
    *(undefined8 *)(this->value)._M_elems = *(undefined8 *)_value->_M_elems;
    *(undefined8 *)((this->value)._M_elems + 2) = uVar1;
  }
  else {
    std::deque<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::push_back
              ((deque<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)this,
               _value);
  }
  this->change = true;
  return;
}

Assistant:

void UniformData::set(const UniformValue &_value, size_t _size, bool _int, bool _queue) {
    bInt = _int;
    size = _size;

    if (_queue && change)
        queue.push( _value );
    else
        value = _value;
    
    change = true;
}